

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

__m256 * __thiscall
Plane::intersect(__m256 *__return_storage_ptr__,Plane *this,Ray8 *ray,DiffGeom8 *dg)

{
  uint uVar1;
  float fVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  Vec3f_8 *in_RAX;
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  Vec3f_8 point;
  Vec3f_8 local_a0;
  __m256 t;
  
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(*__return_storage_ptr__ + 2);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(*__return_storage_ptr__ + 5);
  fVar2 = (*__return_storage_ptr__)[4];
  auVar16._4_4_ = fVar2;
  auVar16._0_4_ = fVar2;
  auVar16._8_4_ = fVar2;
  auVar16._12_4_ = fVar2;
  auVar16._16_4_ = fVar2;
  auVar16._20_4_ = fVar2;
  auVar16._24_4_ = fVar2;
  auVar16._28_4_ = fVar2;
  fVar2 = (*__return_storage_ptr__)[7];
  auVar20._4_4_ = fVar2;
  auVar20._0_4_ = fVar2;
  auVar20._8_4_ = fVar2;
  auVar20._12_4_ = fVar2;
  auVar20._16_4_ = fVar2;
  auVar20._20_4_ = fVar2;
  auVar20._24_4_ = fVar2;
  auVar20._28_4_ = fVar2;
  auVar10 = vsubps_avx(auVar16,*(undefined1 (*) [32])&this[1].normal.y);
  uVar11 = (undefined4)*(ulong *)(*__return_storage_ptr__ + 2);
  auVar14._4_4_ = uVar11;
  auVar14._0_4_ = uVar11;
  auVar14._8_4_ = uVar11;
  auVar14._12_4_ = uVar11;
  auVar14._16_4_ = uVar11;
  auVar14._20_4_ = uVar11;
  auVar14._24_4_ = uVar11;
  auVar14._28_4_ = uVar11;
  auVar3._0_8_ = this->super_Geometry;
  auVar3._8_4_ = (this->pos).x;
  auVar3._12_4_ = (this->pos).y;
  auVar3._16_4_ = (this->pos).z;
  auVar3._20_4_ = (this->normal).x;
  auVar3._24_4_ = (this->normal).y;
  auVar3._28_4_ = (this->normal).z;
  auVar3 = vsubps_avx(auVar14,auVar3);
  auVar12 = vmovshdup_avx(auVar12);
  fVar17 = (float)*(ulong *)(*__return_storage_ptr__ + 5);
  auVar18 = vshufps_avx(auVar18,auVar18,0xf5);
  auVar13._0_8_ = auVar12._0_8_;
  auVar13._8_8_ = auVar13._0_8_;
  auVar13._16_8_ = auVar13._0_8_;
  auVar13._24_8_ = auVar13._0_8_;
  auVar4 = vsubps_avx(auVar13,*(undefined1 (*) [32])&this->material_id);
  auVar19._0_8_ = auVar18._0_8_;
  auVar19._8_8_ = auVar19._0_8_;
  auVar19._16_8_ = auVar19._0_8_;
  auVar19._24_8_ = auVar19._0_8_;
  auVar6._4_4_ = fVar17 * auVar3._4_4_;
  auVar6._0_4_ = fVar17 * auVar3._0_4_;
  auVar6._8_4_ = fVar17 * auVar3._8_4_;
  auVar6._12_4_ = fVar17 * auVar3._12_4_;
  auVar6._16_4_ = fVar17 * auVar3._16_4_;
  auVar6._20_4_ = fVar17 * auVar3._20_4_;
  auVar6._24_4_ = fVar17 * auVar3._24_4_;
  auVar6._28_4_ = auVar3._28_4_;
  auVar12 = vfmadd231ps_fma(auVar6,auVar19,auVar4);
  auVar7._4_4_ = fVar17 * this[2].normal.x;
  auVar7._0_4_ = fVar17 * this[2].pos.z;
  auVar7._8_4_ = fVar17 * this[2].normal.y;
  auVar7._12_4_ = fVar17 * this[2].normal.z;
  auVar7._16_4_ = fVar17 * (float)this[2].material_id;
  auVar7._20_4_ = fVar17 * *(float *)&this[2].field_0x24;
  auVar7._24_4_ = fVar17 * *(float *)&this[3].super_Geometry._vptr_Geometry;
  auVar7._28_4_ = auVar4._28_4_;
  auVar4._0_4_ = this[3].pos.x;
  auVar4._4_4_ = this[3].pos.y;
  auVar4._8_4_ = this[3].pos.z;
  auVar4._12_4_ = this[3].normal.x;
  auVar4._16_4_ = this[3].normal.y;
  auVar4._20_4_ = this[3].normal.z;
  auVar4._24_4_ = this[3].material_id;
  auVar4._28_4_ = *(undefined4 *)&this[3].field_0x24;
  auVar18 = vfmadd231ps_fma(auVar7,auVar19,auVar4);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar20,auVar10);
  auVar10._0_8_ = this[4].super_Geometry;
  auVar10._8_4_ = this[4].pos.x;
  auVar10._12_4_ = this[4].pos.y;
  auVar10._16_4_ = this[4].pos.z;
  auVar10._20_4_ = this[4].normal.x;
  auVar10._24_4_ = this[4].normal.y;
  auVar10._28_4_ = this[4].normal.z;
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar20,auVar10);
  auVar4 = vdivps_avx(ZEXT1632(auVar12),ZEXT1632(auVar18));
  auVar3 = *(undefined1 (*) [32])&this[5].normal.y;
  uVar9 = vcmpps_avx512vl(auVar4,auVar3,1);
  uVar5 = vcmpps_avx512vl(auVar4,*(undefined1 (*) [32])&this[4].material_id,0xe);
  uVar9 = uVar9 & uVar5;
  auVar10 = vmovdqa32_avx512vl(*(undefined1 (*) [32])&this[6].pos.z);
  t[1] = (float)((uint)((byte)(uVar9 >> 1) & 1) * auVar10._4_4_);
  t[0] = (float)((uint)((byte)uVar9 & 1) * auVar10._0_4_);
  t[2] = (float)((uint)((byte)(uVar9 >> 2) & 1) * auVar10._8_4_);
  t[3] = (float)((uint)((byte)(uVar9 >> 3) & 1) * auVar10._12_4_);
  t[4] = (float)((uint)((byte)(uVar9 >> 4) & 1) * auVar10._16_4_);
  uVar1 = (uint)((byte)(uVar9 >> 5) & 1) * auVar10._20_4_;
  t[5] = (float)uVar1;
  t[6] = (float)((uint)((byte)(uVar9 >> 6) & 1) * auVar10._24_4_);
  fVar2 = (float)((uint)(byte)(uVar9 >> 7) * auVar10._28_4_);
  t[7] = fVar2;
  if (((((((((undefined1  [32])t >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           ((undefined1  [32])t >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          ((undefined1  [32])t >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321((undefined1  [32])t >> 0x7f,0) != '\0') || (uVar1 & 1) != 0) ||
       SUB321((undefined1  [32])t >> 0xbf,0) != '\0') ||
      ((undefined1  [32])t & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
      (int)fVar2 < 0) {
    auVar3 = vblendvps_avx(auVar3,auVar4,(undefined1  [32])t);
    *(undefined1 (*) [32])&this[5].normal.y = auVar3;
    in_RAX = Ray8::at(&local_a0,(Ray8 *)this,t);
    auVar3 = *(undefined1 (*) [32])(ray->d).x;
    auVar4 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).x,(undefined1  [32])local_a0.x,
                           (undefined1  [32])t);
    *(undefined1 (*) [32])(ray->o).x = auVar4;
    auVar4 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).y,(undefined1  [32])local_a0.y,
                           (undefined1  [32])t);
    *(undefined1 (*) [32])(ray->o).y = auVar4;
    auVar4 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).z,(undefined1  [32])local_a0.z,
                           (undefined1  [32])t);
    *(undefined1 (*) [32])(ray->o).z = auVar4;
    auVar8._4_4_ = fVar17;
    auVar8._0_4_ = fVar17;
    auVar8._8_4_ = fVar17;
    auVar8._12_4_ = fVar17;
    auVar8._16_4_ = fVar17;
    auVar8._20_4_ = fVar17;
    auVar8._24_4_ = fVar17;
    auVar8._28_4_ = fVar17;
    auVar3 = vblendvps_avx(auVar3,auVar8,(undefined1  [32])t);
    *(undefined1 (*) [32])(ray->d).x = auVar3;
    auVar3 = vblendvps_avx(*(undefined1 (*) [32])(ray->d).y,auVar19,(undefined1  [32])t);
    *(undefined1 (*) [32])(ray->d).y = auVar3;
    auVar3 = vblendvps_avx(*(undefined1 (*) [32])(ray->d).z,auVar20,(undefined1  [32])t);
    *(undefined1 (*) [32])(ray->d).z = auVar3;
    fVar2 = __return_storage_ptr__[1][0];
    auVar15._4_4_ = fVar2;
    auVar15._0_4_ = fVar2;
    auVar15._8_4_ = fVar2;
    auVar15._12_4_ = fVar2;
    auVar15._16_4_ = fVar2;
    auVar15._20_4_ = fVar2;
    auVar15._24_4_ = fVar2;
    auVar15._28_4_ = fVar2;
    auVar3 = vblendvps_avx(*(undefined1 (*) [32])ray->t_min,auVar15,(undefined1  [32])t);
    *(undefined1 (*) [32])ray->t_min = auVar3;
  }
  return in_RAX->x;
}

Assistant:

inline Vec3f_8(Vec3f v)
		: x(_mm256_set1_ps(v.x)), y(_mm256_set1_ps(v.y)), z(_mm256_set1_ps(v.z)){}